

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sandbox.cpp
# Opt level: O3

void __thiscall Sandbox::onPlot(Sandbox *this)

{
  Tracker *pTVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 *puVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  mapped_type pTVar7;
  undefined1 auVar8 [16];
  double dVar9;
  int iVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  PlotType PVar14;
  void *pvVar15;
  Texture *pTVar16;
  mapped_type *ppTVar17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined4 uVar23;
  float fVar24;
  float fVar25;
  string local_68;
  undefined1 local_48 [16];
  
  if ((this->m_sceneRender).renderFbo.m_allocated != true) {
    return;
  }
  PVar14 = this->m_plot;
  if (PVar14 - PLOT_LUMA < 5) {
    bVar11 = haveChange(this);
    if (bVar11) {
      pTVar1 = &(this->uniforms).tracker;
      if ((this->uniforms).tracker.m_running == true) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"plot::histogram","");
        Tracker::begin(pTVar1,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      glBindFramebuffer(0x8d40,(this->m_sceneRender).renderFbo.m_fbo_id);
      iVar12 = vera::getWindowWidth();
      iVar13 = vera::getWindowHeight();
      iVar10 = iVar12 * iVar13 * 3;
      pvVar15 = operator_new__((long)iVar10);
      glReadPixels(0,0,iVar12,iVar13,0x1907,0x1401,pvVar15);
      glBindFramebuffer(0x8d40,0);
      if (iVar10 < 1) {
        local_48 = ZEXT816(0);
      }
      else {
        local_48 = ZEXT816(0);
        lVar18 = 0;
        uVar23 = 0;
        do {
          bVar4 = *(byte *)((long)pvVar15 + lVar18);
          fVar25 = this->m_plot_values[bVar4].field_0.x + 1.0;
          this->m_plot_values[bVar4].field_0.x = fVar25;
          if (fVar25 <= local_48._0_4_) {
            fVar25 = local_48._0_4_;
          }
          bVar5 = *(byte *)((long)pvVar15 + lVar18 + 1);
          fVar24 = this->m_plot_values[bVar5].field_1.y + 1.0;
          this->m_plot_values[bVar5].field_1.y = fVar24;
          if (fVar24 <= fVar25) {
            fVar24 = fVar25;
          }
          bVar6 = *(byte *)((long)pvVar15 + lVar18 + 2);
          iVar12 = (int)((double)bVar6 * 0.114 + (double)bVar4 * 0.299 + (double)bVar5 * 0.587);
          auVar22._0_4_ = this->m_plot_values[bVar6].field_2.z + 1.0;
          auVar22._4_4_ = this->m_plot_values[iVar12].field_3.w + 1.0;
          auVar22._8_8_ = 0;
          this->m_plot_values[bVar6].field_2.z = auVar22._0_4_;
          this->m_plot_values[iVar12].field_3.w = auVar22._4_4_;
          auVar20._4_4_ = uVar23;
          auVar20._0_4_ = fVar24;
          auVar20._8_4_ = 0;
          auVar20._12_4_ = uVar23;
          local_48 = maxps(auVar22,auVar20);
          uVar23 = local_48._4_4_;
          lVar18 = lVar18 + 3;
        } while (lVar18 < iVar10);
      }
      operator_delete__(pvVar15);
      uVar23 = local_48._0_4_;
      lVar18 = 0;
      do {
        auVar19._8_8_ = 0;
        auVar19._0_8_ = *(ulong *)((long)&this->m_plot_values[0].field_0 + lVar18);
        auVar8._4_4_ = uVar23;
        auVar8._0_4_ = uVar23;
        auVar8._8_4_ = uVar23;
        auVar8._12_4_ = uVar23;
        auVar20 = divps(auVar19,auVar8);
        auVar21._8_8_ = 0;
        auVar21._0_8_ = *(ulong *)((long)&this->m_plot_values[0].field_2 + lVar18);
        auVar22 = divps(auVar21,local_48);
        puVar3 = (undefined8 *)((long)&this->m_plot_values[0].field_0 + lVar18);
        *puVar3 = auVar20._0_8_;
        puVar3[1] = auVar22._0_8_;
        lVar18 = lVar18 + 0x10;
      } while (lVar18 != 0x1000);
      pTVar16 = this->m_plot_texture;
      if (pTVar16 == (Texture *)0x0) {
        pTVar16 = (Texture *)operator_new(0x48);
        vera::Texture::Texture(pTVar16);
        this->m_plot_texture = pTVar16;
      }
      (*pTVar16->_vptr_Texture[6])(pTVar16,0x100,1,4,0x20,this->m_plot_values,1,1);
      pTVar7 = this->m_plot_texture;
      paVar2 = &local_68.field_2;
      local_68._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"u_histogram","");
      ppTVar17 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
                 ::operator[](&(this->uniforms).super_Scene.textures,&local_68);
      *ppTVar17 = pTVar7;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      Uniforms::flagChange(&this->uniforms);
      if ((this->uniforms).tracker.m_running != true) {
        return;
      }
      local_68._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"plot::histogram","");
      Tracker::end(pTVar1,&local_68);
      goto LAB_001b8655;
    }
    PVar14 = this->m_plot;
  }
  if (PVar14 == PLOT_MS) {
    pTVar1 = &(this->uniforms).tracker;
    if ((this->uniforms).tracker.m_running == true) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"plot::ms","");
      Tracker::begin(pTVar1,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    memmove(this->m_plot_values,this->m_plot_values + 1,0xff0);
    dVar9 = vera::getDelta();
    this->m_plot_values[0xff].field_0.x = (float)dVar9;
    this->m_plot_values[0xff].field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    this->m_plot_values[0xff].field_2 =
         (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    this->m_plot_values[0xff].field_3.w = 1.0;
    pTVar16 = this->m_plot_texture;
    if (pTVar16 == (Texture *)0x0) {
      pTVar16 = (Texture *)operator_new(0x48);
      vera::Texture::Texture(pTVar16);
      this->m_plot_texture = pTVar16;
    }
    (*pTVar16->_vptr_Texture[6])(pTVar16,0x100,1,4,0x20,this->m_plot_values,1,1);
    if ((this->uniforms).tracker.m_running != true) {
      return;
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"plot::ms","");
    Tracker::end(pTVar1,&local_68);
  }
  else {
    if (PVar14 != PLOT_FPS) {
      return;
    }
    pTVar1 = &(this->uniforms).tracker;
    if ((this->uniforms).tracker.m_running == true) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"plot::fps","");
      Tracker::begin(pTVar1,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    memmove(this->m_plot_values,this->m_plot_values + 1,0xff0);
    dVar9 = vera::getFps();
    this->m_plot_values[0xff].field_0.x = (float)(dVar9 / 60.0);
    this->m_plot_values[0xff].field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    this->m_plot_values[0xff].field_2 =
         (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    this->m_plot_values[0xff].field_3.w = 1.0;
    pTVar16 = this->m_plot_texture;
    if (pTVar16 == (Texture *)0x0) {
      pTVar16 = (Texture *)operator_new(0x48);
      vera::Texture::Texture(pTVar16);
      this->m_plot_texture = pTVar16;
    }
    (*pTVar16->_vptr_Texture[6])(pTVar16,0x100,1,4,0x20,this->m_plot_values,1,1);
    if ((this->uniforms).tracker.m_running != true) {
      return;
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"plot::fps","");
    Tracker::end(pTVar1,&local_68);
  }
LAB_001b8655:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Sandbox::onPlot() {
    // if ( !vera::isGL() )
    //     return;
    if (!m_sceneRender.renderFbo.isAllocated())
        return;

    if ( (m_plot == PLOT_LUMA || m_plot == PLOT_RGB || m_plot == PLOT_RED || m_plot == PLOT_GREEN || m_plot == PLOT_BLUE ) && haveChange() ) {
        TRACK_BEGIN("plot::histogram")


        // Extract pixels
        glBindFramebuffer(GL_FRAMEBUFFER, m_sceneRender.renderFbo.getId());
        int w = vera::getWindowWidth();
        int h = vera::getWindowHeight();
        int c = 3;
        int total = w * h * c;
        unsigned char* pixels = new unsigned char[total];
        glReadPixels(0, 0, w, h, GL_RGB, GL_UNSIGNED_BYTE, pixels);
        glBindFramebuffer(GL_FRAMEBUFFER, 0);

        // Count frequencies of appearances 
        float max_rgb_freq = 0;
        float max_luma_freq = 0;
        glm::vec4 freqs[256];
        for (int i = 0; i < total; i += c) {
            m_plot_values[pixels[i]].r++;
            if (m_plot_values[pixels[i]].r > max_rgb_freq)
                max_rgb_freq = m_plot_values[pixels[i]].r;

            m_plot_values[pixels[i+1]].g++;
            if (m_plot_values[pixels[i+1]].g > max_rgb_freq)
                max_rgb_freq = m_plot_values[pixels[i+1]].g;

            m_plot_values[pixels[i+2]].b++;
            if (m_plot_values[pixels[i+2]].b > max_rgb_freq)
                max_rgb_freq = m_plot_values[pixels[i+2]].b;

            int luma = 0.299 * pixels[i] + 0.587 * pixels[i+1] + 0.114 * pixels[i+2];
            m_plot_values[luma].a++;
            if (m_plot_values[luma].a > max_luma_freq)
                max_luma_freq = m_plot_values[luma].a;
        }
        delete[] pixels;

        // Normalize frequencies
        for (int i = 0; i < 256; i ++)
            m_plot_values[i] = m_plot_values[i] / glm::vec4(max_rgb_freq, max_rgb_freq, max_rgb_freq, max_luma_freq);

        if (m_plot_texture == nullptr)
            m_plot_texture = new vera::Texture();
        m_plot_texture->load(256, 1, 4, 32, &m_plot_values[0], vera::NEAREST, vera::CLAMP);

        uniforms.textures["u_histogram"] = m_plot_texture;
        uniforms.flagChange();
        TRACK_END("plot::histogram")
    }

    else if (m_plot == PLOT_FPS ) {
        TRACK_BEGIN("plot::fps")

        // Push back values one position
        for (int i = 0; i < 255; i ++)
            m_plot_values[i] = m_plot_values[i+1];
        m_plot_values[255] = glm::vec4( vera::getFps()/60.0f, 0.0f, 0.0f, 1.0f);

        if (m_plot_texture == nullptr)
            m_plot_texture = new vera::Texture();

        m_plot_texture->load(256, 1, 4, 32, &m_plot_values[0], vera::NEAREST, vera::CLAMP);
        // uniforms.textures["u_sceneFps"] = m_plot_texture;

        TRACK_END("plot::fps")
    }

    else if (m_plot == PLOT_MS ) {
        TRACK_BEGIN("plot::ms")

        // Push back values one position
        for (int i = 0; i < 255; i ++)
            m_plot_values[i] = m_plot_values[i+1];
        m_plot_values[255] = glm::vec4( vera::getDelta(), 0.0f, 0.0f, 1.0f);

        if (m_plot_texture == nullptr)
            m_plot_texture = new vera::Texture();

        m_plot_texture->load(256, 1, 4, 32, &m_plot_values[0], vera::NEAREST, vera::CLAMP);

        // uniforms.textures["u_sceneMs"] = m_plot_texture;

        TRACK_END("plot::ms")
    }
}